

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoWriter
          (ProtoWriter *this,TypeResolver *type_resolver,Type *type,ByteSink *output,
          ErrorListener *listener)

{
  TypeInfo *pTVar1;
  CodedOutputStream *this_00;
  LocationTrackerInterface *pLVar2;
  pointer *__ptr;
  
  (this->super_StructuredObjectWriter).super_ObjectWriter.use_strict_base64_decoding_ = true;
  (this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter =
       (_func_int **)&PTR__ProtoWriter_003c8e88;
  this->master_type_ = type;
  pTVar1 = TypeInfo::NewTypeInfo(type_resolver);
  this->typeinfo_ = pTVar1;
  this->own_typeinfo_ = true;
  this->done_ = false;
  this->ignore_unknown_fields_ = false;
  this->ignore_unknown_enum_values_ = false;
  this->use_lower_camel_for_enums_ = false;
  this->case_insensitive_enum_parsing_ = true;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
  _M_head_impl = (ProtoElement *)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->size_insert_).
  super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
  ::_M_initialize_map(&(this->size_insert_).
                       super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                      ,0);
  this->output_ = output;
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  (this->buffer_)._M_string_length = 0;
  (this->buffer_).field_2._M_local_buf[0] = '\0';
  io::StringOutputStream::StringOutputStream(&this->adapter_,&this->buffer_);
  this_00 = (CodedOutputStream *)operator_new(0x50);
  io::CodedOutputStream::CodedOutputStream
            (this_00,&(this->adapter_).super_ZeroCopyOutputStream,true);
  (this->stream_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl = this_00;
  this->listener_ = listener;
  this->invalid_depth_ = 0;
  pLVar2 = (LocationTrackerInterface *)operator_new(8);
  pLVar2->_vptr_LocationTrackerInterface = (_func_int **)&PTR__LocationTrackerInterface_003c8fe8;
  (this->tracker_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>.
  _M_head_impl = pLVar2;
  return;
}

Assistant:

ProtoWriter::ProtoWriter(TypeResolver* type_resolver,
                         const google::protobuf::Type& type,
                         strings::ByteSink* output, ErrorListener* listener)
    : master_type_(type),
      typeinfo_(TypeInfo::NewTypeInfo(type_resolver)),
      own_typeinfo_(true),
      done_(false),
      ignore_unknown_fields_(false),
      ignore_unknown_enum_values_(false),
      use_lower_camel_for_enums_(false),
      case_insensitive_enum_parsing_(true),
      element_(nullptr),
      size_insert_(),
      output_(output),
      buffer_(),
      adapter_(&buffer_),
      stream_(new CodedOutputStream(&adapter_)),
      listener_(listener),
      invalid_depth_(0),
      tracker_(new ObjectLocationTracker()) {}